

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::Encode(MunitionDescriptor *this,KDataStream *stream)

{
  Descriptor::Encode(&this->super_Descriptor,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Warhead);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Fuse);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Quantity);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Rate);
  return;
}

Assistant:

void MunitionDescriptor::Encode( KDataStream & stream ) const
{
	Descriptor::Encode( stream );

    stream << m_ui16Warhead
           << m_ui16Fuse
           << m_ui16Quantity
           << m_ui16Rate;
}